

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemSetRowSet(Mem *pMem)

{
  sqlite3 *db_00;
  RowSet *pRVar1;
  RowSet *p;
  sqlite3 *db;
  Mem *pMem_local;
  
  db_00 = pMem->db;
  sqlite3VdbeMemRelease(pMem);
  pRVar1 = sqlite3RowSetInit(db_00);
  if (pRVar1 == (RowSet *)0x0) {
    pMem_local._4_4_ = 7;
  }
  else {
    pMem->z = (char *)pRVar1;
    pMem->flags = 0x410;
    pMem->xDel = sqlite3RowSetDelete;
    pMem_local._4_4_ = 0;
  }
  return pMem_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetRowSet(Mem *pMem){
  sqlite3 *db = pMem->db;
  RowSet *p;
  assert( db!=0 );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  sqlite3VdbeMemRelease(pMem);
  p = sqlite3RowSetInit(db);
  if( p==0 ) return SQLITE_NOMEM;
  pMem->z = (char*)p;
  pMem->flags = MEM_Blob|MEM_Dyn;
  pMem->xDel = sqlite3RowSetDelete;
  return SQLITE_OK;
}